

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O1

void __thiscall
lddgraph::lddrecurse
          (lddgraph *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alreadyscanned,ofstream *gvstream)

{
  pointer pcVar1;
  char *__n;
  long *plVar2;
  int iVar3;
  ostream *poVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  pointer pbVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  string temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  value_type local_188;
  string *local_168;
  long local_160;
  long *local_158;
  long local_150;
  long local_148 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  long *local_120;
  char *local_118;
  long local_110 [2];
  pointer local_100;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  long *local_d8;
  char *local_d0;
  long local_c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  ofstream *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  pointer local_60;
  char *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_168 = file;
  if (this->_quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scanning file ",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(local_168->_M_dataplus)._M_p,
                        local_168->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    file = local_168;
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ldd(this,file,&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(alreadyscanned,file);
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68 = &this->_ignorepatterns;
    uVar8 = 0;
    local_78 = alreadyscanned;
    local_70 = gvstream;
    do {
      local_160 = uVar8 * 0x20;
      bVar11 = true;
      if ((local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length == 0) ||
         (_Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((this->_ignorelist).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->_ignorelist).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar8),
         _Var5._M_current !=
         (this->_ignorelist).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        bVar12 = false;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,local_68);
        lVar10 = *(long *)((long)&((local_138.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_160);
        local_158 = local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,lVar10,
                   *(long *)((long)&(local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_160) + lVar10);
        local_60 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bVar11 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar11) {
          bVar11 = true;
          pbVar6 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_f8 = local_e8;
            pcVar1 = (pbVar6->_M_dataplus)._M_p;
            local_50 = pbVar6;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,pcVar1,pcVar1 + pbVar6->_M_string_length);
            local_120 = local_110;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,local_158,local_150 + (long)local_158);
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            local_188._M_string_length = 0;
            local_188.field_2._M_local_buf[0] = '\0';
            iVar3 = std::__cxx11::string::compare((char *)&local_f8);
            lVar10 = local_f0;
            plVar2 = local_f8;
            bVar12 = true;
            if (iVar3 != 0) {
              if (local_118 < (char *)(local_f0 - 1U)) {
                bVar12 = false;
              }
              else {
                if (local_f0 != 0) {
                  lVar9 = 0;
                  do {
                    if (*(char *)((long)plVar2 + lVar9) != '*') {
                      std::__cxx11::string::push_back((char)&local_188);
                    }
                    if (*(char *)((long)plVar2 + lVar9) == '*') {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_b8,&local_188);
                      std::__cxx11::string::_M_replace
                                ((ulong)&local_188,0,(char *)local_188._M_string_length,0x10707b);
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar10 != lVar9);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_b8,&local_188);
                pbVar6 = local_b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_100 = local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                if ((local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
                  pbVar6 = local_b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1;
                }
                else {
                  std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_120);
                  __n = (char *)pbVar6->_M_string_length;
                  bVar12 = true;
                  if (__n == local_d0) {
                    if (__n == (char *)0x0) {
                      bVar12 = false;
                    }
                    else {
                      iVar3 = bcmp((pbVar6->_M_dataplus)._M_p,local_d8,(size_t)__n);
                      bVar12 = iVar3 != 0;
                    }
                  }
                  if (local_d8 != local_c8) {
                    operator_delete(local_d8,local_c8[0] + 1);
                  }
                  if (bVar12) {
LAB_00105614:
                    bVar12 = false;
                    goto LAB_00105734;
                  }
                }
                bVar12 = true;
                if (pbVar6 != local_100) {
                  local_58 = local_118;
                  bVar7 = false;
                  do {
                    bVar12 = true;
                    std::__cxx11::string::_M_assign((string *)&local_188);
                    if ((char *)local_188._M_string_length == (char *)0x0) break;
                    lVar10 = (long)local_58 - local_188._M_string_length;
                    if (local_188._M_string_length < local_58) {
                      lVar9 = 0;
                      do {
                        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_120);
                        if ((char *)local_188._M_string_length == local_d0) {
                          if ((char *)local_188._M_string_length == (char *)0x0) {
                            bVar12 = true;
                          }
                          else {
                            iVar3 = bcmp(local_188._M_dataplus._M_p,local_d8,
                                         local_188._M_string_length);
                            bVar12 = iVar3 == 0;
                          }
                        }
                        else {
                          bVar12 = false;
                        }
                        if (local_d8 != local_c8) {
                          operator_delete(local_d8,local_c8[0] + 1);
                        }
                        if (bVar12) {
                          bVar7 = true;
                          std::__cxx11::string::erase((ulong)&local_120,0);
                          break;
                        }
                        lVar9 = lVar9 + 1;
                      } while (lVar10 != lVar9);
                    }
                    bVar12 = true;
                    if (!bVar7) goto LAB_00105614;
                    pbVar6 = pbVar6 + 1;
                  } while (pbVar6 != local_100);
                }
              }
            }
LAB_00105734:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,
                              CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                       local_188.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_b8);
            if (local_120 != local_110) {
              operator_delete(local_120,local_110[0] + 1);
            }
            if (local_f8 != local_e8) {
              operator_delete(local_f8,local_e8[0] + 1);
            }
            if (bVar12) break;
            pbVar6 = local_50 + 1;
            bVar11 = pbVar6 != local_60;
          } while (bVar11);
        }
        bVar12 = true;
        gvstream = local_70;
        alreadyscanned = local_78;
      }
      if (bVar12) {
        if (local_158 != local_148) {
          operator_delete(local_158,local_148[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      if (!bVar11) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)gvstream,"\t\"",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)gvstream,(local_168->_M_dataplus)._M_p,
                            local_168->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" -> \"",6);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)((long)&((local_138.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + local_160),
                            *(long *)((long)&(local_138.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_string_length + local_160));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((alreadyscanned->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (alreadyscanned->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,
                           (long)&((local_138.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           local_160);
        if (_Var5._M_current ==
            (alreadyscanned->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          lVar10 = *(long *)((long)&((local_138.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + local_160);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,lVar10,
                     *(long *)((long)&(local_138.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + local_160) + lVar10);
          lddrecurse(this,&local_98,alreadyscanned,gvstream);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_138.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_138.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  return;
}

Assistant:

void lddrecurse(string file, vector<string> & alreadyscanned,
        ofstream & gvstream)
    {
      if (!_quiet)
        cout << "Scanning file " << file << endl;
      vector<string> libraries;
      ldd(file, libraries);
      alreadyscanned.push_back(file);
      for (int i = 0; i < libraries.size(); i++)
      {
        if (libraries[i].size() == 0 || contains(_ignorelist, libraries[i])
            || wildcardcontains(_ignorepatterns, libraries[i]))
          continue;
        gvstream << "\t\"" << file << "\" -> \"" << libraries[i] << "\""
            << endl;
        if (contains(alreadyscanned, libraries[i]))
          continue;
        lddrecurse(libraries[i], alreadyscanned, gvstream);
      }
    }